

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O0

unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> __thiscall
flow::lang::Parser::addExpr(Parser *this)

{
  Report *this_00;
  bool bVar1;
  Token TVar2;
  LiteralType args;
  LiteralType args_2;
  pointer pEVar3;
  pointer right;
  SourceLocation *sloc;
  Parser *in_RSI;
  unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_> local_78;
  allocator<char> local_69;
  string local_68;
  undefined1 local_42 [2];
  undefined1 local_40 [6];
  Opcode opc;
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> rhs;
  Token binop;
  int local_24;
  undefined1 local_20 [8];
  unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> lhs;
  Parser *this_local;
  
  mulExpr((Parser *)local_20);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_20);
  if (bVar1) {
    do {
      TVar2 = token(in_RSI);
      if (1 < TVar2 - Plus) {
        std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::unique_ptr
                  ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)this,
                   (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_20)
        ;
        break;
      }
      rhs._M_t.super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>._M_t.
      super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>.
      super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl._0_4_ = token(in_RSI);
      nextToken(in_RSI);
      mulExpr((Parser *)local_40);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_40);
      TVar2 = (Token)rhs._M_t.
                     super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                     .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
      if (bVar1) {
        pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                           ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                            local_20);
        right = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::get
                          ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                           local_40);
        local_42 = (undefined1  [2])makeOperator(TVar2,pEVar3,right);
        if (local_42 == (undefined1  [2])0x7) {
          this_00 = in_RSI->report_;
          sloc = lastLocation(in_RSI);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"Incompatible binary expression operands ({} {} {}).",
                     &local_69);
          pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                   operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               *)local_20);
          args = (*(pEVar3->super_ASTNode)._vptr_ASTNode[3])();
          TVar2 = (Token)rhs._M_t.
                         super___uniq_ptr_impl<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_flow::lang::Expr_*,_std::default_delete<flow::lang::Expr>_>
                         .super__Head_base<0UL,_flow::lang::Expr_*,_false>._M_head_impl;
          pEVar3 = std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::
                   operator->((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               *)local_40);
          args_2 = (*(pEVar3->super_ASTNode)._vptr_ASTNode[3])();
          diagnostics::Report::typeError<flow::LiteralType,flow::lang::Token,flow::LiteralType>
                    (this_00,sloc,&local_68,args,TVar2,args_2);
          std::__cxx11::string::~string((string *)&local_68);
          std::allocator<char>::~allocator(&local_69);
          std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
          unique_ptr<std::default_delete<flow::lang::Expr>,void>
                    ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                     (nullptr_t)0x0);
          local_24 = 1;
        }
        else {
          std::
          make_unique<flow::lang::BinaryExpr,flow::Opcode&,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>,std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>>
                    ((Opcode *)&local_78,
                     (unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)
                     local_42,(unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>
                               *)local_20);
          std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::operator=
                    ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)local_20,
                     &local_78);
          std::unique_ptr<flow::lang::BinaryExpr,_std::default_delete<flow::lang::BinaryExpr>_>::
          ~unique_ptr(&local_78);
          local_24 = 4;
        }
      }
      else {
        std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
        unique_ptr<std::default_delete<flow::lang::Expr>,void>
                  ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
                   (nullptr_t)0x0);
        local_24 = 1;
      }
      std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
                ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_40);
    } while (local_24 == 4);
  }
  else {
    std::unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>>::
    unique_ptr<std::default_delete<flow::lang::Expr>,void>
              ((unique_ptr<flow::lang::Expr,std::default_delete<flow::lang::Expr>> *)this,
               (nullptr_t)0x0);
  }
  std::unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_>::~unique_ptr
            ((unique_ptr<flow::lang::Expr,_std::default_delete<flow::lang::Expr>_> *)local_20);
  return (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Expr,_std::default_delete<flow::lang::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::addExpr() {
  std::unique_ptr<Expr> lhs = mulExpr();
  if (!lhs) return nullptr;

  for (;;) {
    switch (token()) {
      case Token::Plus:
      case Token::Minus: {
        Token binop = token();
        nextToken();

        std::unique_ptr<Expr> rhs = mulExpr();
        if (!rhs) return nullptr;

        Opcode opc = makeOperator(binop, lhs.get(), rhs.get());
        if (opc == Opcode::EXIT) {
          report_.typeError(
              lastLocation(),
              "Incompatible binary expression operands ({} {} {}).",
              lhs->getType(), binop, rhs->getType());
          return nullptr;
        }

        lhs = std::make_unique<BinaryExpr>(opc, std::move(lhs), std::move(rhs));
        break;
      }
      default:
        return lhs;
    }
  }
}